

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

CURLcode Curl_hsts_parse(hsts *h,char *hostname,char *header)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  hsts *h_00;
  _Bool _Var5;
  int iVar6;
  CURLofft CVar7;
  CURLcode CVar8;
  time_t tVar9;
  stsentry *psVar10;
  long lVar11;
  char *pcVar12;
  bool subdomains;
  curl_off_t expires;
  char *endp;
  curl_off_t local_58;
  time_t local_50;
  hsts *local_48;
  char *local_40;
  char *local_38;
  
  local_58 = 0;
  tVar9 = time((time_t *)0x0);
  _Var5 = Curl_host_is_ipnum(hostname);
  CVar8 = CURLE_OK;
  if (!_Var5) {
    bVar4 = false;
    subdomains = false;
    local_50 = tVar9;
    local_48 = h;
    local_40 = hostname;
    do {
      for (; (*header == ' ' || (*header == '\t')); header = header + 1) {
      }
      iVar6 = curl_strnequal("max-age=",header,8);
      if (iVar6 == 0) {
        iVar6 = curl_strnequal("includesubdomains",header,0x11);
        if (iVar6 == 0) {
          for (; (*header != '\0' && (*header != ';')); header = header + 1) {
          }
        }
        else {
          if (subdomains) {
            return CURLE_BAD_FUNCTION_ARGUMENT;
          }
          header = header + 0x11;
          subdomains = true;
        }
      }
      else {
        if (bVar4) {
LAB_0013274e:
          bVar3 = false;
        }
        else {
          for (pcVar12 = header + 8; (cVar2 = *pcVar12, cVar2 == ' ' || (cVar2 == '\t'));
              pcVar12 = pcVar12 + 1) {
          }
          CVar7 = curlx_strtoofft(pcVar12 + (cVar2 == '\"'),&local_38,10,&local_58);
          if (CVar7 != CURL_OFFT_OK) {
            header = pcVar12 + (cVar2 == '\"');
            if (CVar7 != CURL_OFFT_FLOW) goto LAB_0013274e;
            local_58 = 0x7fffffffffffffff;
          }
          bVar3 = true;
          header = local_38;
          if (cVar2 == '\"') {
            if (*local_38 != '\"') goto LAB_0013274e;
            bVar4 = true;
            bVar3 = true;
            header = local_38 + 1;
          }
          else {
            bVar4 = true;
          }
        }
        if (!bVar3) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
      }
      for (; (pcVar12 = local_40, h_00 = local_48, cVar2 = *header, cVar2 == ' ' || (cVar2 == '\t'))
          ; header = header + 1) {
      }
      pcVar1 = header + (cVar2 == ';');
      header = header + (cVar2 == ';');
    } while (*pcVar1 != '\0');
    CVar8 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (bVar4) {
      if (local_58 == 0) {
        psVar10 = Curl_hsts(local_48,local_40,false);
        CVar8 = CURLE_OK;
        if (psVar10 != (stsentry *)0x0) {
          Curl_node_remove(&psVar10->node);
          (*Curl_cfree)(psVar10->host);
          (*Curl_cfree)(psVar10);
          CVar8 = CURLE_OK;
        }
      }
      else {
        lVar11 = local_50 + local_58;
        if (0x7fffffffffffffff - local_50 < local_58) {
          lVar11 = 0x7fffffffffffffff;
        }
        local_58 = lVar11;
        psVar10 = Curl_hsts(local_48,local_40,false);
        if (psVar10 == (stsentry *)0x0) {
          CVar8 = hsts_create(h_00,pcVar12,subdomains,local_58);
        }
        else {
          psVar10->expires = local_58;
          psVar10->includeSubDomains = subdomains;
          CVar8 = CURLE_OK;
        }
      }
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_hsts_parse(struct hsts *h, const char *hostname,
                         const char *header)
{
  const char *p = header;
  curl_off_t expires = 0;
  bool gotma = FALSE;
  bool gotinc = FALSE;
  bool subdomains = FALSE;
  struct stsentry *sts;
  time_t now = time(NULL);

  if(Curl_host_is_ipnum(hostname))
    /* "explicit IP address identification of all forms is excluded."
       / RFC 6797 */
    return CURLE_OK;

  do {
    while(*p && ISBLANK(*p))
      p++;
    if(strncasecompare("max-age=", p, 8)) {
      bool quoted = FALSE;
      CURLofft offt;
      char *endp;

      if(gotma)
        return CURLE_BAD_FUNCTION_ARGUMENT;

      p += 8;
      while(*p && ISBLANK(*p))
        p++;
      if(*p == '\"') {
        p++;
        quoted = TRUE;
      }
      offt = curlx_strtoofft(p, &endp, 10, &expires);
      if(offt == CURL_OFFT_FLOW)
        expires = CURL_OFF_T_MAX;
      else if(offt)
        /* invalid max-age */
        return CURLE_BAD_FUNCTION_ARGUMENT;
      p = endp;
      if(quoted) {
        if(*p != '\"')
          return CURLE_BAD_FUNCTION_ARGUMENT;
        p++;
      }
      gotma = TRUE;
    }
    else if(strncasecompare("includesubdomains", p, 17)) {
      if(gotinc)
        return CURLE_BAD_FUNCTION_ARGUMENT;
      subdomains = TRUE;
      p += 17;
      gotinc = TRUE;
    }
    else {
      /* unknown directive, do a lame attempt to skip */
      while(*p && (*p != ';'))
        p++;
    }

    while(*p && ISBLANK(*p))
      p++;
    if(*p == ';')
      p++;
  } while(*p);

  if(!gotma)
    /* max-age is mandatory */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(!expires) {
    /* remove the entry if present verbatim (without subdomain match) */
    sts = Curl_hsts(h, hostname, FALSE);
    if(sts) {
      Curl_node_remove(&sts->node);
      hsts_free(sts);
    }
    return CURLE_OK;
  }

  if(CURL_OFF_T_MAX - now < expires)
    /* would overflow, use maximum value */
    expires = CURL_OFF_T_MAX;
  else
    expires += now;

  /* check if it already exists */
  sts = Curl_hsts(h, hostname, FALSE);
  if(sts) {
    /* just update these fields */
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
  }
  else
    return hsts_create(h, hostname, subdomains, expires);

  return CURLE_OK;
}